

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_buffer.cc
# Opt level: O2

void __thiscall draco::DecoderBuffer::DecoderBuffer(DecoderBuffer *this)

{
  this->bitstream_version_ = 0;
  this->data_ = (char *)0x0;
  this->data_size_ = 0;
  this->pos_ = 0;
  (this->bit_decoder_).bit_buffer_ = (uint8_t *)0x0;
  (this->bit_decoder_).bit_buffer_end_ = (uint8_t *)0x0;
  (this->bit_decoder_).bit_offset_ = 0;
  this->bit_mode_ = false;
  return;
}

Assistant:

DecoderBuffer::DecoderBuffer()
    : data_(nullptr),
      data_size_(0),
      pos_(0),
      bit_mode_(false),
      bitstream_version_(0) {}